

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet.cpp
# Opt level: O2

void jsonnet_jpath_add(JsonnetVm *vm,char *path_)

{
  allocator<char> local_31;
  string path;
  
  if (*path_ != '\0') {
    std::__cxx11::string::string<std::allocator<char>>((string *)&path,path_,&local_31);
    if (path._M_dataplus._M_p[path._M_string_length - 1] != '/') {
      std::__cxx11::string::push_back((char)&path);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vm->jpaths,
               &path);
    std::__cxx11::string::~string((string *)&path);
  }
  return;
}

Assistant:

void jsonnet_jpath_add(JsonnetVm *vm, const char *path_)
{
    if (std::strlen(path_) == 0)
        return;
    std::string path = path_;
    if (path[path.length() - 1] != '/')
        path += '/';
    vm->jpaths.emplace_back(path);
}